

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# DynamicObject.cpp
# Opt level: O2

void __thiscall
Js::DynamicObject::ResetObject(DynamicObject *this,DynamicType *newType,BOOL keepProperties)

{
  Type *this_00;
  long *plVar1;
  ScriptContext *pSVar2;
  Type *pTVar3;
  code *pcVar4;
  bool bVar5;
  char cVar6;
  int iVar7;
  undefined4 *puVar8;
  ScriptContext *pSVar9;
  undefined8 local_58;
  Var typeTransitionMap;
  Var stackTraceValue;
  Var weakMapKeyMapValue;
  Var mutationBpValue;
  Var embedderData;
  
  if (newType == (DynamicType *)0x0) {
    AssertCount = AssertCount + 1;
    Throw::LogAssert();
    puVar8 = (undefined4 *)__tls_get_addr(&PTR_013e5f18);
    *puVar8 = 1;
    bVar5 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Types/DynamicObject.cpp"
                                ,0x2dd,"(newType != __null)","newType != NULL");
    if (!bVar5) goto LAB_00c3a980;
    *puVar8 = 0;
  }
  if (keepProperties != 0) {
    iVar7 = (*((newType->typeHandler).ptr)->_vptr_DynamicTypeHandler[0x4d])();
    if (iVar7 == 0) {
      iVar7 = (*((newType->typeHandler).ptr)->_vptr_DynamicTypeHandler[6])();
      if (iVar7 == 0) goto LAB_00c3a60f;
    }
    AssertCount = AssertCount + 1;
    Throw::LogAssert();
    puVar8 = (undefined4 *)__tls_get_addr(&PTR_013e5f18);
    *puVar8 = 1;
    bVar5 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Types/DynamicObject.cpp"
                                ,0x2de,
                                "(!keepProperties || (!newType->GetTypeHandler()->IsDeferredTypeHandler() && newType->GetTypeHandler()->GetPropertyCount() == 0))"
                                ,
                                "!keepProperties || (!newType->GetTypeHandler()->IsDeferredTypeHandler() && newType->GetTypeHandler()->GetPropertyCount() == 0)"
                               );
    if (!bVar5) goto LAB_00c3a980;
    *puVar8 = 0;
  }
LAB_00c3a60f:
  plVar1 = *(long **)((this->super_RecyclableObject).type.ptr + 1);
  cVar6 = (**(code **)(*plVar1 + 0x2e8))(plVar1);
  if (cVar6 != '\0') {
    AssertCount = AssertCount + 1;
    Throw::LogAssert();
    puVar8 = (undefined4 *)__tls_get_addr(&PTR_013e5f18);
    *puVar8 = 1;
    bVar5 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Types/DynamicObject.cpp"
                                ,0x2ef,"(!oldTypeHandler->HasAnyFixedProperties())",
                                "!oldTypeHandler->HasAnyFixedProperties()");
    if (!bVar5) goto LAB_00c3a980;
    *puVar8 = 0;
  }
  this_00 = &(this->super_RecyclableObject).type;
  Memory::WriteBarrierPtr<Js::Type>::WriteBarrierSet(this_00,&newType->super_Type);
  bVar5 = IsAnyArray(this);
  if (!bVar5) {
    this->field_1 = (anon_union_8_2_815e7e51_for_DynamicObject_2)0x0;
  }
  (**(code **)(*plVar1 + 0x250))(plVar1,this);
  pSVar2 = (((((this->super_RecyclableObject).type.ptr)->javascriptLibrary).ptr)->
           super_JavascriptLibraryBase).scriptContext.ptr;
  pSVar9 = Js::Type::GetScriptContext(&newType->super_Type);
  if (pSVar2 != pSVar9) {
    AssertCount = AssertCount + 1;
    Throw::LogAssert();
    puVar8 = (undefined4 *)__tls_get_addr(&PTR_013e5f18);
    *puVar8 = 1;
    bVar5 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Types/DynamicObject.cpp"
                                ,0x2f8,"(this->GetScriptContext() == newType->GetScriptContext())",
                                "this->GetScriptContext() == newType->GetScriptContext()");
    if (!bVar5) {
LAB_00c3a980:
      pcVar4 = (code *)invalidInstructionException();
      (*pcVar4)();
    }
    *puVar8 = 0;
  }
  iVar7 = (**(code **)(**(long **)(this_00->ptr + 1) + 0x268))();
  if (iVar7 == 0) {
    if (keepProperties == 0) {
      plVar1 = *(long **)((this->super_RecyclableObject).type.ptr + 1);
      (**(code **)(*plVar1 + 600))(plVar1,this,0);
    }
    typeTransitionMap = (Var)0x0;
    iVar7 = (*(this->super_RecyclableObject).super_FinalizableObject.super_IRecyclerVisitedObject.
              _vptr_IRecyclerVisitedObject[0x14])
                      (this,this,5,&typeTransitionMap,0,
                       (((((this->super_RecyclableObject).type.ptr)->javascriptLibrary).ptr)->
                       super_JavascriptLibraryBase).scriptContext.ptr);
    if (iVar7 == 0) {
      typeTransitionMap = (Var)0x0;
    }
    else {
      (*(this->super_RecyclableObject).super_FinalizableObject.super_IRecyclerVisitedObject.
        _vptr_IRecyclerVisitedObject[0x19])(this,5,0,0,0);
    }
    stackTraceValue = (Var)0x0;
    iVar7 = (*(this->super_RecyclableObject).super_FinalizableObject.super_IRecyclerVisitedObject.
              _vptr_IRecyclerVisitedObject[0x14])
                      (this,this,7,&stackTraceValue,0,
                       (((((this->super_RecyclableObject).type.ptr)->javascriptLibrary).ptr)->
                       super_JavascriptLibraryBase).scriptContext.ptr);
    if (iVar7 == 0) {
      stackTraceValue = (Var)0x0;
    }
    else {
      (*(this->super_RecyclableObject).super_FinalizableObject.super_IRecyclerVisitedObject.
        _vptr_IRecyclerVisitedObject[0x19])(this,7,0,8,0);
    }
    weakMapKeyMapValue = (Var)0x0;
    iVar7 = (*(this->super_RecyclableObject).super_FinalizableObject.super_IRecyclerVisitedObject.
              _vptr_IRecyclerVisitedObject[0x14])
                      (this,this,0xe,&weakMapKeyMapValue,0,
                       (((((this->super_RecyclableObject).type.ptr)->javascriptLibrary).ptr)->
                       super_JavascriptLibraryBase).scriptContext.ptr);
    if (iVar7 == 0) {
      weakMapKeyMapValue = (Var)0x0;
    }
    else {
      (*(this->super_RecyclableObject).super_FinalizableObject.super_IRecyclerVisitedObject.
        _vptr_IRecyclerVisitedObject[0x19])(this,0xe,0,8,0);
    }
    mutationBpValue = (Var)0x0;
    iVar7 = (*(this->super_RecyclableObject).super_FinalizableObject.super_IRecyclerVisitedObject.
              _vptr_IRecyclerVisitedObject[0x14])
                      (this,this,0xf,&mutationBpValue,0,
                       (((((this->super_RecyclableObject).type.ptr)->javascriptLibrary).ptr)->
                       super_JavascriptLibraryBase).scriptContext.ptr);
    if (iVar7 == 0) {
      mutationBpValue = (Var)0x0;
    }
    else {
      (*(this->super_RecyclableObject).super_FinalizableObject.super_IRecyclerVisitedObject.
        _vptr_IRecyclerVisitedObject[0x19])(this,0xf,0,8,0);
    }
    local_58 = 0;
    iVar7 = (*(this->super_RecyclableObject).super_FinalizableObject.super_IRecyclerVisitedObject.
              _vptr_IRecyclerVisitedObject[0x14])
                      (this,this,1,&local_58,0,
                       (((((this->super_RecyclableObject).type.ptr)->javascriptLibrary).ptr)->
                       super_JavascriptLibraryBase).scriptContext.ptr);
    if (iVar7 != 0) {
      (*(this->super_RecyclableObject).super_FinalizableObject.super_IRecyclerVisitedObject.
        _vptr_IRecyclerVisitedObject[0x19])(this,1,0,8,0);
    }
    if (keepProperties != 0) {
      pTVar3 = (this->super_RecyclableObject).type.ptr;
      plVar1 = *(long **)(pTVar3 + 1);
      (**(code **)(*plVar1 + 0x260))
                (plVar1,this,
                 (((pTVar3->javascriptLibrary).ptr)->super_JavascriptLibraryBase).scriptContext.ptr,
                 0);
      if (typeTransitionMap != (Var)0x0) {
        (*(this->super_RecyclableObject).super_FinalizableObject.super_IRecyclerVisitedObject.
          _vptr_IRecyclerVisitedObject[0x19])(this,5,typeTransitionMap,0,0);
      }
      if (stackTraceValue != (Var)0x0) {
        (*(this->super_RecyclableObject).super_FinalizableObject.super_IRecyclerVisitedObject.
          _vptr_IRecyclerVisitedObject[0x19])(this,7,stackTraceValue,8,0);
      }
      if (weakMapKeyMapValue != (Var)0x0) {
        (*(this->super_RecyclableObject).super_FinalizableObject.super_IRecyclerVisitedObject.
          _vptr_IRecyclerVisitedObject[0x19])(this,0xe,weakMapKeyMapValue,8,0);
      }
      if (mutationBpValue != (Var)0x0) {
        (*(this->super_RecyclableObject).super_FinalizableObject.super_IRecyclerVisitedObject.
          _vptr_IRecyclerVisitedObject[0x19])(this,0xf,mutationBpValue,8,0);
      }
    }
  }
  return;
}

Assistant:

void
    DynamicObject::ResetObject(DynamicType* newType, BOOL keepProperties)
    {
        Assert(newType != NULL);
        Assert(!keepProperties || (!newType->GetTypeHandler()->IsDeferredTypeHandler() && newType->GetTypeHandler()->GetPropertyCount() == 0));

        // This is what's going on here.  The newType comes from the (potentially) new script context, but the object is
        // described by the old type handler, so we want to keep that type handler.  We set the new type on the object, but
        // then re-set the type handler of that type back to the old type handler.  In the process, we may actually change
        // the type of the object again (if the new type was locked) via DuplicateType; the newer type will then also be
        // from the new script context.
        DynamicType * oldType = this->GetDynamicType();
        DynamicTypeHandler* oldTypeHandler = oldType->GetTypeHandler();

#if ENABLE_FIXED_FIELDS
        // Consider: Because we've disabled fixed properties on DOM objects, we don't need to rely on a type change here to
        // invalidate fixed properties.  Under some circumstances (with F12 tools enabled) an object which
        // is already in the new context can be reset and newType == oldType. If we re-enable fixed properties on DOM objects
        // we'll have to investigate and address this issue.
        // Assert(newType != oldType);
        // We only expect DOM objects to ever be reset and we explicitly disable fixed properties on DOM objects.
        Assert(!oldTypeHandler->HasAnyFixedProperties());
#endif

        this->type = newType;
        if (!IsAnyArray(this))
        {
            this->objectArray = nullptr;
        }
        oldTypeHandler->ResetTypeHandler(this);
        Assert(this->GetScriptContext() == newType->GetScriptContext());

        if (this->GetTypeHandler()->IsDeferredTypeHandler())
        {
            return;
        }

        if (!keepProperties)
        {
            this->GetTypeHandler()->SetAllPropertiesToUndefined(this, false);
        }

        // Marshalling cannot handle non-Var values, so extract
        // the two internal property values that could appear on a CEO, clear them to null which
        // marshalling does handle, and then restore them after marshalling.  Neither property's
        // data needs marshalling because:
        //  1. StackTrace's data does not contain references to JavaScript objects that would need marshalling.
        //  2. Values in the WeakMapKeyMap can only be accessed by the WeakMap object that put them there.  If
        //     that WeakMap is marshalled it will take care of any necessary marshalling of the value by virtue
        //     of being wrapped in CrossSite<>.

        Var stackTraceValue = nullptr;
        if (this->GetInternalProperty(this, InternalPropertyIds::StackTrace, &stackTraceValue, nullptr, this->GetScriptContext()))
        {
            this->SetInternalProperty(InternalPropertyIds::StackTrace, nullptr, PropertyOperation_None, nullptr);
        }
        else
        {
            // Above GetInternalProperty fails - which means the stackTraceValue is filed with Missing result. Reset to null so that we will not restore it back below.
            stackTraceValue = nullptr;
        }

        Var weakMapKeyMapValue = nullptr;
        if (this->GetInternalProperty(this, InternalPropertyIds::WeakMapKeyMap, &weakMapKeyMapValue, nullptr, this->GetScriptContext()))
        {
            this->SetInternalProperty(InternalPropertyIds::WeakMapKeyMap, nullptr, PropertyOperation_Force, nullptr);
        }
        else
        {
            weakMapKeyMapValue = nullptr;
        }

        Var mutationBpValue = nullptr;
        if (this->GetInternalProperty(this, InternalPropertyIds::MutationBp, &mutationBpValue, nullptr, this->GetScriptContext()))
        {
            this->SetInternalProperty(InternalPropertyIds::MutationBp, nullptr, PropertyOperation_Force, nullptr);
        }
        else
        {
            mutationBpValue = nullptr;
        }

        Var embedderData = nullptr;
        if (this->GetInternalProperty(this, InternalPropertyIds::EmbedderData,  &embedderData, nullptr, this->GetScriptContext()))
        {
          this->SetInternalProperty(InternalPropertyIds::EmbedderData, nullptr, PropertyOperation_Force, nullptr);
        }
        else
        {
          embedderData = nullptr;
        }

        // If value of TypeOfPrototypeObjectDictionary was set undefined above, reset it to nullptr so we don't type cast it wrongly to TypeTransitionMap* or we don't marshal the non-Var dictionary below
        Var typeTransitionMap = nullptr;
        if (this->GetInternalProperty(this, InternalPropertyIds::TypeOfPrototypeObjectDictionary, &typeTransitionMap, nullptr, this->GetScriptContext()))
        {
            this->SetInternalProperty(InternalPropertyIds::TypeOfPrototypeObjectDictionary, nullptr, PropertyOperation_Force, nullptr);
        }

        if (keepProperties)
        {
            this->GetTypeHandler()->MarshalAllPropertiesToScriptContext(this, this->GetScriptContext(), false);

            if (stackTraceValue)
            {
                this->SetInternalProperty(InternalPropertyIds::StackTrace, stackTraceValue, PropertyOperation_None, nullptr);
            }
            if (weakMapKeyMapValue)
            {
                this->SetInternalProperty(InternalPropertyIds::WeakMapKeyMap, weakMapKeyMapValue, PropertyOperation_Force, nullptr);
            }
            if (mutationBpValue)
            {
                this->SetInternalProperty(InternalPropertyIds::MutationBp, mutationBpValue, PropertyOperation_Force, nullptr);
            }
            if (embedderData)
            {
              this->SetInternalProperty(InternalPropertyIds::EmbedderData, embedderData, PropertyOperation_Force, nullptr);
            }
        }
    }